

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O1

void __thiscall
ClipperLib::ClipperOffset::Execute(ClipperOffset *this,PolyTree *solution,double delta)

{
  vector<ClipperLib::PolyNode*,std::allocator<ClipperLib::PolyNode*>> *this_00;
  _List_node_base *p_Var1;
  long lVar2;
  PolyNode *pPVar3;
  long lVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  pointer pIVar7;
  long lVar8;
  long lVar9;
  uint uVar10;
  PolyNode *outerNode;
  IntRect r;
  Path outer;
  Clipper clpr;
  PolyNode *local_190;
  IntRect local_188;
  Path local_168;
  undefined1 local_148 [136];
  ClipperBase local_c0;
  
  PolyTree::Clear(solution);
  FixOrientations(this);
  DoOffset(this,delta);
  local_c0.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.m_edges.super__Vector_base<ClipperLib::TEdge_*,_std::allocator<ClipperLib::TEdge_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.m_PolyOuts.
  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.m_PolyOuts.
  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.m_PolyOuts.
  super__Vector_base<ClipperLib::OutRec_*,_std::allocator<ClipperLib::OutRec_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.m_Scanbeam.c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.m_Scanbeam.c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.m_Scanbeam.c.super__Vector_base<long_long,_std::allocator<long_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.m_MinimaList.
  super__Vector_base<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_c0.m_MinimaList.
  super__Vector_base<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c0.m_MinimaList.
  super__Vector_base<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c0.m_CurrentLM._M_current = (LocalMinimum *)0x0;
  local_c0.m_UseFullRange = false;
  local_148._0_8_ = &PTR_ExecuteInternal_00197c50;
  local_c0._vptr_ClipperBase = (_func_int **)&PTR__Clipper_00197c98;
  p_Var1 = (_List_node_base *)(local_148 + 0x58);
  local_148._8_8_ = (pointer)0x0;
  local_148._16_8_ = (pointer)0x0;
  local_148._24_8_ = (pointer)0x0;
  local_148._32_8_ = (pointer)0x0;
  local_148._40_8_ = (pointer)0x0;
  local_148._48_8_ = (pointer)0x0;
  local_148._56_8_ = (pointer)0x0;
  local_148._64_8_ = (pointer)0x0;
  local_148._72_8_ = (pointer)0x0;
  local_148._104_8_ = 0;
  local_148[0x78] = false;
  local_148[0x84] = false;
  local_148[0x86] = false;
  local_c0.m_PreserveCollinear = false;
  local_c0.m_HasOpenPaths = false;
  local_148._88_8_ = p_Var1;
  local_148._96_8_ = p_Var1;
  ClipperBase::AddPaths(&local_c0,&this->m_destPolys,ptSubject,true);
  if (0.0 < delta) {
    Clipper::Execute((Clipper *)local_148,ctUnion,solution,pftPositive,pftPositive);
    goto LAB_0016df1e;
  }
  ClipperBase::GetBounds
            (&local_188,(ClipperBase *)(*(_func_int **)(local_148._0_8_ + -0x18) + (long)local_148))
  ;
  local_168.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pIVar7 = (pointer)operator_new(0x40);
  local_168.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_finish = pIVar7 + 4;
  pIVar7[3].X = 0;
  pIVar7[3].Y = 0;
  pIVar7[2].X = 0;
  pIVar7[2].Y = 0;
  pIVar7[1].X = 0;
  pIVar7[1].Y = 0;
  pIVar7->X = 0;
  pIVar7->Y = 0;
  pIVar7->X = local_188.left + -10;
  pIVar7->Y = local_188.bottom + 10;
  pIVar7[1].X = local_188.right + 10;
  pIVar7[1].Y = local_188.bottom + 10;
  pIVar7[2].X = local_188.right + 10;
  pIVar7[2].Y = local_188.top + -10;
  pIVar7[3].X = local_188.left + -10;
  pIVar7[3].Y = local_188.top + -10;
  local_168.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_start = pIVar7;
  local_168.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_168.super__Vector_base<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  ClipperBase::AddPath
            ((ClipperBase *)(local_148 + (long)*(_func_int **)(local_148._0_8_ + -0x18)),&local_168,
             ptSubject,true);
  local_148[0x84] = true;
  Clipper::Execute((Clipper *)local_148,ctUnion,solution,pftNegative,pftNegative);
  if ((*(long *)(solution + 0x28) - (long)*(long **)(solution + 0x20) & 0x7fffffff8U) == 8) {
    lVar2 = **(long **)(solution + 0x20);
    uVar10 = (uint)((ulong)(*(long *)(lVar2 + 0x28) - *(long *)(lVar2 + 0x20)) >> 3);
    if ((int)uVar10 < 1) goto LAB_0016def4;
    this_00 = (vector<ClipperLib::PolyNode*,std::allocator<ClipperLib::PolyNode*>> *)
              (solution + 0x20);
    std::vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_>::reserve
              ((vector<ClipperLib::PolyNode_*,_std::allocator<ClipperLib::PolyNode_*>_> *)this_00,
               (ulong)(uVar10 & 0x7fffffff));
    **(undefined8 **)this_00 = **(undefined8 **)(lVar2 + 0x20);
    *(undefined8 *)(**(long **)this_00 + 0x38) = *(undefined8 *)(lVar2 + 0x38);
    lVar8 = *(long *)(lVar2 + 0x20);
    if (1 < (int)((ulong)(*(long *)(lVar2 + 0x28) - lVar8) >> 3)) {
      lVar9 = 1;
      do {
        pPVar3 = *(PolyNode **)(lVar8 + lVar9 * 8);
        lVar8 = *(long *)(solution + 0x20);
        lVar4 = *(long *)(solution + 0x28);
        local_190 = pPVar3;
        std::vector<ClipperLib::PolyNode*,std::allocator<ClipperLib::PolyNode*>>::
        emplace_back<ClipperLib::PolyNode*>(this_00,&local_190);
        pPVar3->Parent = (PolyNode *)solution;
        pPVar3->Index = (uint)((ulong)(lVar4 - lVar8) >> 3);
        lVar9 = lVar9 + 1;
        lVar8 = *(long *)(lVar2 + 0x20);
      } while (lVar9 < (int)((ulong)(*(long *)(lVar2 + 0x28) - lVar8) >> 3));
    }
  }
  else {
LAB_0016def4:
    PolyTree::Clear(solution);
  }
  operator_delete(pIVar7,0x40);
LAB_0016df1e:
  local_148._0_8_ = &PTR_ExecuteInternal_00197c50;
  local_c0._vptr_ClipperBase = (_func_int **)&PTR__Clipper_00197c98;
  p_Var6 = (_List_node_base *)local_148._88_8_;
  while (p_Var6 != p_Var1) {
    p_Var5 = p_Var6->_M_next;
    operator_delete(p_Var6,0x18);
    p_Var6 = p_Var5;
  }
  if ((pointer)local_148._56_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._56_8_,local_148._72_8_ - local_148._56_8_);
  }
  if ((pointer)local_148._32_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._32_8_,local_148._48_8_ - local_148._32_8_);
  }
  if ((pointer)local_148._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_148._8_8_,local_148._24_8_ - local_148._8_8_);
  }
  ClipperBase::~ClipperBase(&local_c0);
  return;
}

Assistant:

void ClipperOffset::Execute(PolyTree& solution, double delta)
{
  solution.Clear();
  FixOrientations();
  DoOffset(delta);

  //now clean up 'corners' ...
  Clipper clpr;
  clpr.AddPaths(m_destPolys, ptSubject, true);
  if (delta > 0)
  {
    clpr.Execute(ctUnion, solution, pftPositive, pftPositive);
  }
  else
  {
    IntRect r = clpr.GetBounds();
    Path outer(4);
    outer[0] = IntPoint(r.left - 10, r.bottom + 10);
    outer[1] = IntPoint(r.right + 10, r.bottom + 10);
    outer[2] = IntPoint(r.right + 10, r.top - 10);
    outer[3] = IntPoint(r.left - 10, r.top - 10);

    clpr.AddPath(outer, ptSubject, true);
    clpr.ReverseSolution(true);
    clpr.Execute(ctUnion, solution, pftNegative, pftNegative);
    //remove the outer PolyNode rectangle ...
    if (solution.ChildCount() == 1 && solution.Childs[0]->ChildCount() > 0)
    {
      PolyNode* outerNode = solution.Childs[0];
      solution.Childs.reserve(outerNode->ChildCount());
      solution.Childs[0] = outerNode->Childs[0];
      solution.Childs[0]->Parent = outerNode->Parent;
      for (int i = 1; i < outerNode->ChildCount(); ++i)
        solution.AddChild(*outerNode->Childs[i]);
    }
    else
      solution.Clear();
  }
}